

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlsave.c
# Opt level: O3

long xmlSaveTree(xmlSaveCtxtPtr ctxt,xmlNodePtr cur)

{
  uint uVar1;
  xmlChar *pxVar2;
  xmlOutputBufferPtr buf;
  htmlDocPtr doc;
  bool bVar3;
  int iVar4;
  xmlChar *pxVar5;
  xmlChar *encoding;
  xmlChar *local_40;
  
  if (cur == (xmlNodePtr)0x0 || ctxt == (xmlSaveCtxtPtr)0x0) {
    return -1;
  }
  uVar1 = ctxt->options;
  if ((uVar1 & 0x10) != 0) {
    xhtmlNodeDumpOutput(ctxt,cur);
    return 0;
  }
  if ((cur->type == XML_NAMESPACE_DECL) || (cur->doc == (_xmlDoc *)0x0)) {
    if ((uVar1 & 0x40) == 0) goto LAB_001acd1f;
  }
  else if (((uVar1 & 0x40) == 0) &&
          ((uVar1 & 0x20) != 0 || cur->doc->type != XML_HTML_DOCUMENT_NODE)) {
LAB_001acd1f:
    xmlNodeDumpOutputInternal(ctxt,cur);
    return 0;
  }
  pxVar2 = ctxt->encoding;
  buf = ctxt->buf;
  xmlInitParser();
  doc = cur->doc;
  pxVar5 = pxVar2;
  if (doc == (htmlDocPtr)0x0) {
    local_40 = (xmlChar *)0x0;
  }
  else {
    local_40 = doc->encoding;
    if (ctxt->encoding == (xmlChar *)0x0) {
      pxVar5 = local_40;
      if (local_40 == (xmlChar *)0x0) {
        pxVar5 = pxVar2;
      }
    }
    else {
      doc->encoding = ctxt->encoding;
    }
    if (pxVar5 == (xmlChar *)0x0) {
      pxVar5 = htmlGetMetaEncoding(doc);
    }
    else {
      htmlSetMetaEncoding(doc,pxVar5);
    }
  }
  encoding = (xmlChar *)"HTML";
  if (pxVar5 != (xmlChar *)0x0) {
    encoding = pxVar5;
  }
  if (((pxVar2 == (xmlChar *)0x0) && (buf->encoder == (xmlCharEncodingHandlerPtr)0x0)) &&
     (buf->conv == (xmlBufPtr)0x0)) {
    iVar4 = xmlSaveSwitchEncoding((xmlSaveCtxtPtr)ctxt->buf,(char *)encoding);
    bVar3 = true;
    if (iVar4 < 0) goto LAB_001ace04;
  }
  else {
    bVar3 = false;
  }
  htmlNodeDumpFormatOutput(buf,doc,cur,(char *)encoding,ctxt->options & 1);
  if (bVar3 && pxVar2 == (xmlChar *)0x0) {
    xmlSaveClearEncoding((xmlSaveCtxtPtr)ctxt->buf);
  }
  if (doc == (htmlDocPtr)0x0) {
    return 0;
  }
LAB_001ace04:
  doc->encoding = local_40;
  return 0;
}

Assistant:

long
xmlSaveTree(xmlSaveCtxtPtr ctxt, xmlNodePtr cur)
{
    long ret = 0;

    if ((ctxt == NULL) || (cur == NULL)) return(-1);
#ifdef LIBXML_HTML_ENABLED
    if (ctxt->options & XML_SAVE_XHTML) {
        xhtmlNodeDumpOutput(ctxt, cur);
        return(ret);
    }
    if (((cur->type != XML_NAMESPACE_DECL) && (cur->doc != NULL) &&
         (cur->doc->type == XML_HTML_DOCUMENT_NODE) &&
         ((ctxt->options & XML_SAVE_AS_XML) == 0)) ||
        (ctxt->options & XML_SAVE_AS_HTML)) {
	htmlNodeDumpOutputInternal(ctxt, cur);
	return(ret);
    }
#endif
    xmlNodeDumpOutputInternal(ctxt, cur);
    return(ret);
}